

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapCmpCallback3(jx9_hashmap_node *pA,jx9_hashmap_node *pB,void *pCmpData)

{
  int iVar1;
  int rc;
  sxi32 iFlags;
  jx9_value sB;
  jx9_value sA;
  void *pCmpData_local;
  jx9_hashmap_node *pB_local;
  jx9_hashmap_node *pA_local;
  
  if (pCmpData == (void *)0x0) {
    iVar1 = HashmapNodeCmp(pA,pB,0);
  }
  else {
    jx9MemObjInit(pA->pMap->pVm,(jx9_value *)&sB.nIdx);
    jx9MemObjInit(pA->pMap->pVm,(jx9_value *)&rc);
    jx9HashmapExtractNodeValue(pA,(jx9_value *)&sB.nIdx,0);
    jx9HashmapExtractNodeValue(pB,(jx9_value *)&rc,0);
    if ((int)pCmpData == 5) {
      if ((sA.x.iVal._0_4_ & 1) == 0) {
        jx9MemObjToString((jx9_value *)&sB.nIdx);
      }
      if ((sB.x.iVal._0_4_ & 1) == 0) {
        jx9MemObjToString((jx9_value *)&rc);
      }
    }
    else {
      jx9MemObjToNumeric((jx9_value *)&sB.nIdx);
      jx9MemObjToNumeric((jx9_value *)&rc);
    }
    iVar1 = jx9MemObjCmp((jx9_value *)&sB.nIdx,(jx9_value *)&rc,0,0);
    jx9MemObjRelease((jx9_value *)&sB.nIdx);
    jx9MemObjRelease((jx9_value *)&rc);
  }
  pA_local._4_4_ = -iVar1;
  return pA_local._4_4_;
}

Assistant:

static sxi32 HashmapCmpCallback3(jx9_hashmap_node *pA, jx9_hashmap_node *pB, void *pCmpData)
{
	jx9_value sA, sB;
	sxi32 iFlags;
	int rc;
	if( pCmpData == 0 ){
		/* Perform a standard comparison */
		rc = HashmapNodeCmp(pA, pB, FALSE);
		return -rc;
	}
	iFlags = SX_PTR_TO_INT(pCmpData);
	/* Duplicate node values */
	jx9MemObjInit(pA->pMap->pVm, &sA);
	jx9MemObjInit(pA->pMap->pVm, &sB);
	jx9HashmapExtractNodeValue(pA, &sA, FALSE);
	jx9HashmapExtractNodeValue(pB, &sB, FALSE);
	if( iFlags == 5 ){
		/* String cast */
		if( (sA.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sA);
		}
		if( (sB.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sB);
		}
	}else{
		/* Numeric cast */
		jx9MemObjToNumeric(&sA);
		jx9MemObjToNumeric(&sB);
	}
	/* Perform the comparison */
	rc = jx9MemObjCmp(&sA, &sB, FALSE, 0);
	jx9MemObjRelease(&sA);
	jx9MemObjRelease(&sB);
	return -rc;
}